

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.hpp
# Opt level: O2

void * __thiscall cppjit::builder::builder::compile(builder *this)

{
  int iVar1;
  undefined4 extraout_var;
  cppjit_exception *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  ofstream kernel_file;
  
  if (this->has_source_ != false) {
    std::__cxx11::string::string
              ((string *)&kernel_file,detail::DEFAULT_KERNEL_COMPILE_DIR,(allocator *)&local_260);
    make_compile_dir(this,(string *)&kernel_file);
    std::__cxx11::string::~string((string *)&kernel_file);
    if (this->has_inline_source_ == true) {
      std::__cxx11::string::_M_assign((string *)&this->source_dir);
      std::operator+(&local_240,&this->source_dir,&this->kernel_name);
      std::operator+(&local_260,&local_240,".cpp");
      std::ofstream::ofstream(&kernel_file,(string *)&local_260,_S_out);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_240);
      std::operator<<((ostream *)&kernel_file,(string *)&this->source);
      std::ofstream::close();
      std::ofstream::~ofstream(&kernel_file);
    }
    iVar1 = (**this->_vptr_builder)(this);
    return (void *)CONCAT44(extraout_var,iVar1);
  }
  this_00 = (cppjit_exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&kernel_file,"source not set",(allocator *)&local_260);
  cppjit_exception::cppjit_exception(this_00,(string *)&kernel_file);
  __cxa_throw(this_00,&cppjit_exception::typeinfo,cppjit_exception::~cppjit_exception);
}

Assistant:

void *compile() {
    if (!has_source_) {
      throw cppjit_exception("source not set");
    }
    // make sure it actually exists
    make_compile_dir();

    if (has_inline_source_) {
      source_dir = compile_dir;
      std::ofstream kernel_file(source_dir + kernel_name + ".cpp");
      kernel_file << source;
      kernel_file.close();
    }

    return compile_impl();
  }